

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O0

BufferCreateInfo * __thiscall
vkt::Draw::BufferCreateInfo::operator=(BufferCreateInfo *this,BufferCreateInfo *other)

{
  size_type sVar1;
  reference pvVar2;
  BufferCreateInfo *other_local;
  BufferCreateInfo *this_local;
  
  (this->super_VkBufferCreateInfo).sType = (other->super_VkBufferCreateInfo).sType;
  (this->super_VkBufferCreateInfo).pNext = (other->super_VkBufferCreateInfo).pNext;
  (this->super_VkBufferCreateInfo).size = (other->super_VkBufferCreateInfo).size;
  (this->super_VkBufferCreateInfo).usage = (other->super_VkBufferCreateInfo).usage;
  (this->super_VkBufferCreateInfo).flags = (other->super_VkBufferCreateInfo).flags;
  (this->super_VkBufferCreateInfo).sharingMode = (other->super_VkBufferCreateInfo).sharingMode;
  (this->super_VkBufferCreateInfo).queueFamilyIndexCount =
       (other->super_VkBufferCreateInfo).queueFamilyIndexCount;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (&this->m_queueFamilyIndices,&other->m_queueFamilyIndices);
  sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    (&this->m_queueFamilyIndices);
  if (sVar1 == 0) {
    (this->super_VkBufferCreateInfo).pQueueFamilyIndices = (deUint32 *)0x0;
  }
  else {
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->m_queueFamilyIndices,0);
    (this->super_VkBufferCreateInfo).pQueueFamilyIndices = pvVar2;
  }
  return this;
}

Assistant:

BufferCreateInfo & BufferCreateInfo::operator= (const BufferCreateInfo &other)
{
	sType						= other.sType;
	pNext						= other.pNext;
	size						= other.size;
	usage						= other.usage;
	flags						= other.flags;
	sharingMode					= other.sharingMode;
	queueFamilyIndexCount		= other.queueFamilyIndexCount;

	m_queueFamilyIndices		= other.m_queueFamilyIndices;

	DE_ASSERT(m_queueFamilyIndices.size() == queueFamilyIndexCount);

	if (m_queueFamilyIndices.size())
	{
		pQueueFamilyIndices = &m_queueFamilyIndices[0];
	}
	else
	{
		pQueueFamilyIndices = DE_NULL;
	}

	return *this;
}